

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

void cJSON_AddItemToObjectCS(cJSON *object,char *string,cJSON *item)

{
  cJSON *item_local;
  char *string_local;
  cJSON *object_local;
  
  if (item != (cJSON *)0x0) {
    if (((item->type & 0x200U) == 0) && (item->string != (char *)0x0)) {
      (*global_hooks.deallocate)(item->string);
    }
    item->string = string;
    item->type = item->type | 0x200;
    cJSON_AddItemToArray(object,item);
  }
  return;
}

Assistant:

CJSON_PUBLIC(void) cJSON_AddItemToObjectCS(cJSON *object, const char *string, cJSON *item)
{
    if (!item)
    {
        return;
    }
    if (!(item->type & cJSON_StringIsConst) && item->string)
    {
        global_hooks.deallocate(item->string);
    }
    item->string = (char*)string;
    item->type |= cJSON_StringIsConst;
    cJSON_AddItemToArray(object, item);
}